

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

void __thiscall testing::internal::MutexBase::AssertHeld(MutexBase *this)

{
  pthread_t __thread1;
  char cVar1;
  int iVar2;
  pthread_t __thread2;
  ostream *poVar3;
  bool bVar4;
  GTestLog local_14 [4];
  
  if (this->has_owner_ == true) {
    __thread1 = this->owner_;
    __thread2 = pthread_self();
    iVar2 = pthread_equal(__thread1,__thread2);
    bVar4 = iVar2 != 0;
  }
  else {
    bVar4 = false;
  }
  cVar1 = testing::internal::IsTrue(bVar4);
  if (cVar1 == '\0') {
    testing::internal::GTestLog::GTestLog
              (local_14,GTEST_FATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/include/gtest/internal/gtest-port.h"
               ,0x661);
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Condition has_owner_ && pthread_equal(owner_, pthread_self()) failed. "
                            );
    poVar3 = std::operator<<(poVar3,"The current thread is not holding the mutex @");
    std::ostream::_M_insert<void_const*>(poVar3);
    testing::internal::GTestLog::~GTestLog(local_14);
  }
  return;
}

Assistant:

void AssertHeld() const {
    GTEST_CHECK_(has_owner_ && pthread_equal(owner_, pthread_self()))
        << "The current thread is not holding the mutex @" << this;
  }